

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::SetLocal(VirtualMachine *this)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  Variable VVar6;
  undefined4 uStack_9c;
  Variable top;
  string local_88;
  size_t local_68;
  size_t index;
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *locals;
  shared_ptr<runtime::StackFrame> stackFrame;
  allocator<char> local_31;
  string local_30;
  VirtualMachine *local_10;
  VirtualMachine *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"No stack frame found in SetLocal",&local_31);
    panic(this,&local_30);
  }
  std::shared_ptr<runtime::StackFrame>::shared_ptr
            ((shared_ptr<runtime::StackFrame> *)&locals,&this->stackFrame);
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&locals);
  index = (size_t)&peVar2->locals;
  sVar3 = getByteCodeParameter(this);
  local_68 = sVar3;
  sVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                    ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)index);
  if (sVar4 <= sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Index out of bounds in SetLocal",
               (allocator<char> *)((long)&top.field_1 + 7));
    panic(this,&local_88);
  }
  VVar6 = popOpStack(this);
  top._0_8_ = VVar6.field_1;
  pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                     ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)index,
                      local_68);
  *(ulong *)pvVar5 = CONCAT44(uStack_9c,VVar6.type);
  pvVar5->field_1 = (anon_union_8_6_52c89740_for_Variable_1)top._0_8_;
  advance(this);
  std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)&locals);
  return;
}

Assistant:

void runtime::VirtualMachine::SetLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in SetLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in SetLocal");
    return;
  }

  Variable top = this->popOpStack();

  locals->at(index) = top;

  this->advance();
}